

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O3

void __thiscall
stringToUnit_handlingOfSquared_Test::~stringToUnit_handlingOfSquared_Test
          (stringToUnit_handlingOfSquared_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(stringToUnit, handlingOfSquared)
{
    auto u1 = unit_from_string("square foot second");
    EXPECT_EQ(u1, precise::ft.pow(2) * precise::s);

    auto u2 = unit_from_string("pascal squared second");
    EXPECT_EQ(u2, precise::Pa.pow(2) * precise::s);

    auto u2b = unit_from_string("pascal squared per second squared");
    EXPECT_EQ(u2b, precise::Pa.pow(2) / precise::s.pow(2));

    auto u2c = unit_from_string("pascal squared per second squared per kg");
    EXPECT_EQ(u2c, precise::Pa.pow(2) / precise::s.pow(2) / precise::kg);

    auto u2d = unit_from_string("pascal cubed second");
    EXPECT_EQ(u2d, precise::Pa.pow(3) * precise::s);

    auto u2e = unit_from_string("pascal cubed per second cubed");
    EXPECT_EQ(u2e, precise::Pa.pow(3) / precise::s.pow(3));

    auto u2f = unit_from_string("pascal squared per second squared per kg");
    EXPECT_EQ(u2f, precise::Pa.pow(2) / precise::s.pow(2) / precise::kg);

    auto u2g = unit_from_string("pascal squared / second squared / kg");
    EXPECT_EQ(u2g, precise::Pa.pow(2) / precise::s.pow(2) / precise::kg);

    auto u3 = unit_from_string("coulomb metre squared per volt");
    EXPECT_EQ(u3, precise::C * precise::m.pow(2) / precise::V);

    auto u3v = unit_from_string(
        "kg per coulomb metre squared per second squared per volt");
    EXPECT_EQ(
        u3v,
        precise::kg / (precise::C * precise::m.pow(2)) / precise::V /
            precise::s.pow(2));

    auto u4 = unit_from_string("ampere square metre per joule second");
    EXPECT_EQ(u4, precise::A * precise::m.pow(2) / (precise::J * precise::s));

    auto u5 =
        unit_from_string("meter per square seconds per square root of hertz");
    EXPECT_EQ(u5, precise::special::ASD);

    auto u6 = unit_from_string(
        "degree Fahrenheit hour square foot per British "
        "thermal unit (international table) inch");

    EXPECT_EQ(
        u6,
        precise::degF * precise::hr * precise::ft.pow(2) /
            precise::energy::btu_it / precise::in);

    auto u7 = unit_from_string("gram square decimeter");
    EXPECT_EQ(u7, g * (deci * m).pow(2));
}